

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::getPossibleTimings
          (MultipleShootingTranscription *this,
          vector<double,_std::allocator<double>_> *stateEvaluations,
          vector<double,_std::allocator<double>_> *controlEvaluations)

{
  pointer paVar1;
  pointer pdVar2;
  pointer pdVar3;
  bool bVar4;
  pointer paVar5;
  size_type __new_size;
  long lVar6;
  long lVar7;
  MeshPointOrigin first;
  MeshPointOrigin ignored;
  long *local_a8;
  long local_98 [2];
  long *local_88;
  long local_78 [2];
  int local_68;
  long *local_60;
  long local_50 [2];
  long *local_40;
  long local_30 [3];
  
  bVar4 = preliminaryChecks(this);
  if ((bVar4) && (bVar4 = setMeshPoints(this), bVar4)) {
    __new_size = this->m_totalMeshes - 1;
    if ((long)(stateEvaluations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(stateEvaluations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(stateEvaluations,__new_size);
    }
    if ((long)(controlEvaluations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(controlEvaluations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != this->m_controlMeshes) {
      std::vector<double,_std::allocator<double>_>::resize(controlEvaluations,this->m_controlMeshes)
      ;
    }
    MeshPointOrigin::FirstPoint();
    MeshPointOrigin::Ignored();
    paVar5 = (this->m_meshPoints).
             super__Vector_base<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    paVar1 = (this->m_meshPointsEnd)._M_current;
    if (paVar5 != paVar1) {
      pdVar2 = (stateEvaluations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (controlEvaluations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      lVar7 = 0;
      do {
        if ((paVar5->origin).m_priority != local_68) {
          pdVar2[lVar7] = paVar5->time;
          lVar7 = lVar7 + 1;
        }
        if (paVar5->type == Control) {
          pdVar3[lVar6] = paVar5->time;
          lVar6 = lVar6 + 1;
        }
        paVar5 = paVar5 + 1;
      } while (paVar5 != paVar1);
    }
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
    if (local_88 != local_78) {
      operator_delete(local_88,local_78[0] + 1);
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8,local_98[0] + 1);
    }
    return true;
  }
  return false;
}

Assistant:

bool getPossibleTimings(std::vector<double>& stateEvaluations, std::vector<double>& controlEvaluations) {

                if (!preliminaryChecks()) {
                    return false;
                }

                if (!setMeshPoints()){
                    return false;
                }

                if (stateEvaluations.size() != (m_totalMeshes - 1)) {
                    stateEvaluations.resize(m_totalMeshes - 1);
                }

                if (controlEvaluations.size() != m_controlMeshes) {
                    controlEvaluations.resize(m_controlMeshes);
                }

                size_t stateIndex = 0, controlIndex = 0;

                MeshPointOrigin first = MeshPointOrigin::FirstPoint();
                MeshPointOrigin ignored = MeshPointOrigin::Ignored();

                for (auto mesh = m_meshPoints.begin(); mesh != m_meshPointsEnd; ++mesh){

                    assert(mesh->origin != ignored);

                    if (mesh->origin != first){
                        stateEvaluations[stateIndex] = mesh->time;
                        stateIndex++;
                    }
                    if (mesh->type == MeshPointType::Control){
                        controlEvaluations[controlIndex] = mesh->time;
                        controlIndex++;
                    }
                }

                return true;
            }